

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.cc
# Opt level: O0

void re2c::vernum(void)

{
  char *pcVar1;
  ulong uVar2;
  undefined8 uVar3;
  allocator<char> local_29;
  string local_28 [8];
  string vernum;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_28,"0.16",&local_29);
  std::allocator<char>::~allocator(&local_29);
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_28);
  if (*pcVar1 == '.') {
    std::__cxx11::string::insert((ulong)local_28,(char *)0x0);
  }
  std::__cxx11::string::erase((ulong)local_28,2);
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_28);
  if (*pcVar1 == '.') {
    std::__cxx11::string::insert((ulong)local_28,(char *)0x2);
  }
  std::__cxx11::string::erase((ulong)local_28,4);
  uVar2 = std::__cxx11::string::length();
  if (5 < uVar2) {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_28);
    if ('/' < *pcVar1) {
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_28);
      if (*pcVar1 < ':') goto LAB_00185aeb;
    }
  }
  std::__cxx11::string::insert((ulong)local_28,(char *)0x4);
LAB_00185aeb:
  std::__cxx11::string::resize((ulong)local_28,'\x06');
  uVar3 = std::__cxx11::string::c_str();
  printf("%s\n",uVar3);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void vernum ()
{
	std::string vernum (PACKAGE_VERSION);
	if (vernum[1] == '.')
	{
		vernum.insert(0, "0");
	}
	vernum.erase(2, 1);
	if (vernum[3] == '.')
	{
		vernum.insert(2, "0");
	}
	vernum.erase(4, 1);
	if (vernum.length() < 6 || vernum[5] < '0' || vernum[5] > '9')
	{
		vernum.insert(4, "0");
	}
	vernum.resize(6, '0');

	printf ("%s\n", vernum.c_str ());
}